

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_wsh_miniscript_Test::TestBody(Descriptor_Parse_wsh_miniscript_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  char *in_R9;
  AssertHelper local_1ce0;
  Message local_1cd8;
  DescriptorScriptReference local_1cd0;
  Script local_1980;
  string local_1948;
  Script local_1928;
  string local_18f0;
  undefined1 local_18d0 [8];
  AssertionResult gtest_ar_11;
  Message local_18b8;
  DescriptorScriptType local_18ac;
  DescriptorScriptReference local_18a8;
  DescriptorScriptType local_1554;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_1520;
  Message local_1518;
  DescriptorScriptReference local_1510;
  bool local_11b9;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1188;
  Message local_1180;
  DescriptorScriptReference local_1178;
  bool local_e21;
  undefined1 local_e20 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_df0;
  Message local_de8;
  DescriptorScriptReference local_de0;
  bool local_a89;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar__2;
  Message local_a70;
  Script local_a68;
  string local_a30;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_9e0;
  Message local_9d8;
  bool local_9c9;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar__1;
  Message local_9b0;
  DescriptorScriptType local_9a8;
  DescriptorScriptType local_9a4;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_8;
  Message local_988;
  HashType local_980;
  HashType local_97c;
  undefined1 local_978 [8];
  AssertionResult gtest_ar_7;
  Message local_960;
  AddressType local_958;
  AddressType local_954;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_6;
  Message local_938;
  Address local_930;
  string local_7b8;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_768;
  Message local_760;
  bool local_751;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_;
  Message local_738;
  int local_72c;
  size_type local_728;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_4;
  Message local_708;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_3;
  Message local_6c8;
  string local_6c0;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_2;
  Message local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_1;
  Message local_668;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_660;
  AssertHelper local_648;
  Message local_640;
  Script local_638;
  AssertHelper local_600;
  Message local_5f8;
  Script local_5f0;
  AssertHelper local_5b8;
  Message local_5b0;
  string local_5a8;
  AssertHelper local_588;
  Message local_580 [2];
  Descriptor local_570;
  undefined1 local_408 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list1;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_260 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_list;
  Script gen_script;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  undefined1 local_30 [8];
  string descriptor;
  Descriptor_Parse_wsh_miniscript_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "wsh(thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01)))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"",
             (allocator *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen_script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
            *)local_260);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_30,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_408);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_570,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_570);
      cfd::core::Descriptor::~Descriptor(&local_570);
    }
  }
  else {
    testing::Message::Message(local_580);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2fd,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_588,local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(local_580);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_5a8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_208,(string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
    }
  }
  else {
    testing::Message::Message(&local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2fe,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(&local_5b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_5f0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_5f0);
      cfd::core::Script::~Script(&local_5f0);
    }
  }
  else {
    testing::Message::Message(&local_5f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x2ff,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message(&local_5f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_638,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408);
      cfd::core::Script::operator=
                ((Script *)
                 &script_list.
                  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_638);
      cfd::core::Script::~Script(&local_638);
    }
  }
  else {
    testing::Message::Message(&local_640);
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x300,
               "Expected: gen_script = desc.GetLockingScript(arg_list1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::Message::~Message(&local_640);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReferenceAll
                (&local_660,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::operator=((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_260,&local_660);
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector(&local_660);
    }
  }
  else {
    testing::Message::Message(&local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x301,
               "Expected: script_list = desc.GetReferenceAll(nullptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_668);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_680,"desc_str.c_str()","descriptor.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x302,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  cfd::core::Script::ToString_abi_cxx11_(&local_6c0,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6a0,"locking_script.ToString().c_str()",
             "\"0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1\"",pcVar2,
             "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  std::__cxx11::string::~string((string *)&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x304,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_700,
             (Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6e0,"gen_script.ToString().c_str()",
             "\"0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1\"",pcVar2,
             "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  std::__cxx11::string::~string((string *)&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x306,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  local_728 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)local_260);
  local_72c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_720,"script_list.size()","1",&local_728,&local_72c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x308,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  sVar4 = std::
          vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
          ::size((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_260);
  if (sVar4 == 1) {
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_751 = cfd::core::DescriptorScriptReference::HasAddress(pvVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_750,&local_751,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
    if (!bVar1) {
      testing::Message::Message(&local_760);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_5.message_,(internal *)local_750,
                 (AssertionResult *)"script_list[0].HasAddress()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_768,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_768,&local_760);
      testing::internal::AssertHelper::~AssertHelper(&local_768);
      std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_760);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GenerateAddress(&local_930,pvVar5,kMainnet);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_7b8,&local_930);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_798,
               "script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str()",
               "\"bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch\"",pcVar2,
               "bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch");
    std::__cxx11::string::~string((string *)&local_7b8);
    cfd::core::Address::~Address(&local_930);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
    if (!bVar1) {
      testing::Message::Message(&local_938);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_938);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_938);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_954 = cfd::core::DescriptorScriptReference::GetAddressType(pvVar5);
    local_958 = kP2wshAddress;
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              ((EqHelper<false> *)local_950,"script_list[0].GetAddressType()",
               "AddressType::kP2wshAddress",&local_954,&local_958);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
    if (!bVar1) {
      testing::Message::Message(&local_960);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_960);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_960);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_97c = cfd::core::DescriptorScriptReference::GetHashType(pvVar5);
    local_980 = kP2wsh;
    testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
              ((EqHelper<false> *)local_978,"script_list[0].GetHashType()","HashType::kP2wsh",
               &local_97c,&local_980);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
    if (!bVar1) {
      testing::Message::Message(&local_988);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_978);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_988);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_988);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_9a4 = cfd::core::DescriptorScriptReference::GetScriptType(pvVar5);
    local_9a8 = kDescriptorScriptWsh;
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((EqHelper<false> *)local_9a0,"script_list[0].GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptWsh",&local_9a4,&local_9a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
    if (!bVar1) {
      testing::Message::Message(&local_9b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x30f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_9b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_9b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    local_9c9 = cfd::core::DescriptorScriptReference::HasChild(pvVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_9c8,&local_9c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
    if (!bVar1) {
      testing::Message::Message(&local_9d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_9.message_,(internal *)local_9c8,
                 (AssertionResult *)"script_list[0].HasChild()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_9e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x311,pcVar2);
      testing::internal::AssertHelper::operator=(&local_9e0,&local_9d8);
      testing::internal::AssertHelper::~AssertHelper(&local_9e0);
      std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_9d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_a68,pvVar5);
    cfd::core::Script::ToString_abi_cxx11_(&local_a30,&local_a68);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_a10,"script_list[0].GetRedeemScript().ToString().c_str()",
               "\"2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL\""
               ,pcVar2,
               "2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL"
              );
    std::__cxx11::string::~string((string *)&local_a30);
    cfd::core::Script::~Script(&local_a68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
    if (!bVar1) {
      testing::Message::Message(&local_a70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x313,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_a70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_de0,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasChild(&local_de0);
    local_a89 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a88,&local_a89,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_de0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
    if (!bVar1) {
      testing::Message::Message(&local_de8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_a88,
                 (AssertionResult *)"script_list[0].GetChild().HasChild()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_df0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x314,pcVar2);
      testing::internal::AssertHelper::operator=(&local_df0,&local_de8);
      testing::internal::AssertHelper::~AssertHelper(&local_df0);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_de8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1178,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasKey(&local_1178);
    local_e21 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_e20,&local_e21,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e20);
    if (!bVar1) {
      testing::Message::Message(&local_1180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_e20,
                 (AssertionResult *)"script_list[0].GetChild().HasKey()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x315,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1188,&local_1180);
      testing::internal::AssertHelper::~AssertHelper(&local_1188);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_1180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e20);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1510,pvVar5);
    bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(&local_1510);
    local_11b9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_11b8,&local_11b9,(type *)0x0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1510);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b8);
    if (!bVar1) {
      testing::Message::Message(&local_1518);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_10.message_,(internal *)local_11b8,
                 (AssertionResult *)"script_list[0].GetChild().HasRedeemScript()","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1520,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x316,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1520,&local_1518);
      testing::internal::AssertHelper::~AssertHelper(&local_1520);
      std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_1518);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b8);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_18a8,pvVar5);
    local_1554 = cfd::core::DescriptorScriptReference::GetScriptType(&local_18a8);
    local_18ac = kDescriptorScriptMiniscript;
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((EqHelper<false> *)local_1550,"script_list[0].GetChild().GetScriptType()",
               "DescriptorScriptType::kDescriptorScriptMiniscript",&local_1554,&local_18ac);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_18a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1550);
    if (!bVar1) {
      testing::Message::Message(&local_18b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1550);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x317,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_18b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_18b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1550);
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript(&local_1928,pvVar5);
    cfd::core::Script::ToString_abi_cxx11_(&local_18f0,&local_1928);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pvVar5 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                           *)local_260,0);
    cfd::core::DescriptorScriptReference::GetChild(&local_1cd0,pvVar5);
    cfd::core::DescriptorScriptReference::GetLockingScript(&local_1980,&local_1cd0);
    cfd::core::Script::ToString_abi_cxx11_(&local_1948,&local_1980);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_18d0,"script_list[0].GetRedeemScript().ToString().c_str()",
               "script_list[0].GetChild().GetLockingScript().ToString().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_1948);
    cfd::core::Script::~Script(&local_1980);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1cd0);
    std::__cxx11::string::~string((string *)&local_18f0);
    cfd::core::Script::~Script(&local_1928);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18d0);
    if (!bVar1) {
      testing::Message::Message(&local_1cd8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1ce0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x319,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1ce0,&local_1cd8);
      testing::internal::AssertHelper::~AssertHelper(&local_1ce0);
      testing::Message::~Message(&local_1cd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_18d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_408);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_260);
  cfd::core::Script::~Script
            ((Script *)
             &script_list.
              super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_wsh_miniscript) {
  std::string descriptor = "wsh(thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01)))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list1));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(nullptr));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "0 6a6c42f62db9fab091ffaf930e0a847646898d225e1ad94ff43226e20180b9d1");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qdfky9a3dh8atpy0l47fsuz5ywergnrfztcddjnl5xgnwyqvqh8gschn2ch");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2wshAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2wsh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptWsh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "2 03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 2 OP_CHECKMULTISIG OP_TOALTSTACK 1 036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00 1 OP_CHECKMULTISIG OP_FROMALTSTACK OP_ADD OP_TOALTSTACK 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 OP_CHECKSIG OP_FROMALTSTACK OP_ADD 2 OP_EQUAL");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_FALSE(script_list[0].GetChild().HasKey());
    EXPECT_FALSE(script_list[0].GetChild().HasRedeemScript());
    EXPECT_EQ(script_list[0].GetChild().GetScriptType(), DescriptorScriptType::kDescriptorScriptMiniscript);
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      script_list[0].GetChild().GetLockingScript().ToString().c_str());
  }
}